

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> __thiscall
flow::lang::Parser::decl(Parser *this)

{
  Token TVar1;
  Parser *in_RSI;
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  Parser *this_local;
  
  this_local = this;
  TVar1 = token(in_RSI);
  if (TVar1 == Var) {
    varDecl((Parser *)&stack0xffffffffffffffe0);
    std::unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>>::
    unique_ptr<flow::lang::VariableSym,std::default_delete<flow::lang::VariableSym>,void>
              ((unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>> *)this,
               (unique_ptr<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>_> *
               )&stack0xffffffffffffffe0);
    std::unique_ptr<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>_>::
    ~unique_ptr((unique_ptr<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>_>
                 *)&stack0xffffffffffffffe0);
  }
  else if (TVar1 == Handler) {
    handlerDecl((Parser *)local_28,SUB81(in_RSI,0));
    std::unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>>::
    unique_ptr<flow::lang::HandlerSym,std::default_delete<flow::lang::HandlerSym>,void>
              ((unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>> *)this,
               (unique_ptr<flow::lang::HandlerSym,_std::default_delete<flow::lang::HandlerSym>_> *)
               local_28);
    std::unique_ptr<flow::lang::HandlerSym,_std::default_delete<flow::lang::HandlerSym>_>::
    ~unique_ptr((unique_ptr<flow::lang::HandlerSym,_std::default_delete<flow::lang::HandlerSym>_> *)
                local_28);
  }
  else if (TVar1 == Ident) {
    handlerDecl((Parser *)local_30,SUB81(in_RSI,0));
    std::unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>>::
    unique_ptr<flow::lang::HandlerSym,std::default_delete<flow::lang::HandlerSym>,void>
              ((unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>> *)this,
               (unique_ptr<flow::lang::HandlerSym,_std::default_delete<flow::lang::HandlerSym>_> *)
               local_30);
    std::unique_ptr<flow::lang::HandlerSym,_std::default_delete<flow::lang::HandlerSym>_>::
    ~unique_ptr((unique_ptr<flow::lang::HandlerSym,_std::default_delete<flow::lang::HandlerSym>_> *)
                local_30);
  }
  else {
    std::unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>>::
    unique_ptr<std::default_delete<flow::lang::Symbol>,void>
              ((unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>> *)this,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Symbol> Parser::decl() {
  switch (token()) {
    case Token::Var:
      return varDecl();
    case Token::Handler:
      return handlerDecl(true);
    case Token::Ident:
      return handlerDecl(false);
    default:
      return nullptr;
  }
}